

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O2

void GetReplace(bitset<32UL> flags)

{
  byte *pbVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int iVar5;
  bitset<32UL> flags_local;
  reference local_48;
  reference local_38;
  
  flags_local.super__Base_bitset<1UL>._M_w = flags.super__Base_bitset<1UL>._M_w;
  if (t_assoc == set_associative) {
    if (t_replace != LRU) {
      if (t_replace == Random) {
        iVar5 = rand();
        auVar4._8_8_ = 0;
        auVar4._0_8_ = i_cache_set;
        temp = (ulong)(long)iVar5 /
               (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffff)) / auVar4,0) + 1U);
        current_line = i_cache_set * current_set + temp;
      }
      goto LAB_00102c7c;
    }
  }
  else {
    if (t_assoc != full_associative) goto LAB_00102c7c;
    if (t_replace != LRU) {
      if (t_replace == Random) {
        iVar5 = rand();
        auVar3._8_8_ = 0;
        auVar3._0_8_ = i_num_line;
        current_line = (ulong)(long)iVar5 /
                       (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffff)) / auVar3,0) + 1U);
      }
      goto LAB_00102c7c;
    }
  }
  LruUnhitUnspace();
LAB_00102c7c:
  uVar2 = cache_item[current_line].super__Base_bitset<1UL>._M_w;
  if (((uint)uVar2 >> 0x1d & 1) != 0) {
    cache_item[current_line].super__Base_bitset<1UL>._M_w = uVar2 & 0xffffffff9fffffff;
  }
  j = 0x1c;
  for (i = 0x1f; 0x1f - (ulong)bit_tag < i; i = i - 1) {
    local_38._M_bpos = (size_t)((uint)i & 0x3f);
    local_48._M_wp = (_WordT *)(cache_item + current_line);
    local_48._M_bpos = (size_t)((uint)j & 0x3f);
    local_38._M_wp = (_WordT *)&flags_local;
    std::bitset<32UL>::reference::operator=(&local_48,&local_38);
    j = j - 1;
  }
  pbVar1 = (byte *)((long)&cache_item[current_line].super__Base_bitset<1UL>._M_w + 3);
  *pbVar1 = *pbVar1 | 0x40;
  return;
}

Assistant:

void GetReplace(bitset<32> flags)
{
    if(t_assoc == direct_mapped)
    {
    }
    else if(t_assoc == full_associative)
    {
        if(t_replace == Random)
        {
            current_line = rand()/(RAND_MAX/i_num_line+1); // a random line in(0,i_num_line-1)
        }
        else if(t_replace == LRU)
        {
            LruUnhitUnspace();
        }
    }
    else if(t_assoc == set_associative) // 从本组中任选一行，进行替换
    {
        if(t_replace == Random)
        {
            temp = rand()/(RAND_MAX/i_cache_set+1); // a random line in(0,i_cache_set-1)
            current_line = current_set*i_cache_set+temp; // a random line in current_set
        }
        else if(t_replace == LRU)
        {
            LruUnhitUnspace();
        }
    }

    if(cache_item[current_line][29]) //dirty位必须为1才写入
    {
        GetWrite(); //写入内存
    }

#ifndef NDEBUG
    cout << "Read from Main Memory to Cache: " << endl;
#endif // NDEBUG

    for(i=31,j=28; i>(31ul-bit_tag); i--,j--) //设置标记
    {
        cache_item[current_line][j] = flags[i];
        assert(j>0);
    }

    cache_item[current_line][30] = true; //设置hit位为true
}